

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O0

uint8_t apx_vm_size_type_to_variant(apx_sizeType_t size_type)

{
  undefined1 local_a;
  uint8_t variant;
  apx_sizeType_t size_type_local;
  
  local_a = 0xff;
  if (size_type == '\x01') {
    local_a = '\0';
  }
  else if (size_type == '\x02') {
    local_a = '\x01';
  }
  else if (size_type == '\x03') {
    local_a = '\x02';
  }
  return local_a;
}

Assistant:

uint8_t apx_vm_size_type_to_variant(apx_sizeType_t size_type)
{
   uint8_t variant = APX_VM_VARIANT_INVALID;
   switch (size_type)
   {
   case APX_SIZE_TYPE_UINT8:
      variant = APX_VM_VARIANT_UINT8;
      break;
   case APX_SIZE_TYPE_UINT16:
      variant = APX_VM_VARIANT_UINT16;
      break;
   case APX_SIZE_TYPE_UINT32:
      variant = APX_VM_VARIANT_UINT32;
      break;
   }
   return variant;
}